

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-view.h
# Opt level: O3

void __thiscall BinNE<0,0,0>::check(BinNE<0,0,0> *this)

{
  return;
}

Assistant:

int64_t getShadowVal() const {
		int64_t v = (type & 1) != 0 ? -var->getShadowVal() : var->getShadowVal();
		if ((type & 2) != 0) {
			v *= a;
		}
		if ((type & 4) != 0) {
			v += b;
		}
		return v;
	}